

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool DivisionCornerCaseHelper2<short,_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_1>
     ::DivisionCornerCase2
               (int lhs,SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        rhs,
               SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               *result)

{
  bool bVar1;
  short sVar2;
  int iVar3;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *in_RDX;
  undefined2 in_SI;
  int in_EDI;
  short tmp;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *unaff_retaddr;
  short local_12;
  int iVar4;
  undefined1 in_stack_fffffffffffffffe;
  undefined1 in_stack_ffffffffffffffff;
  
  iVar4 = in_EDI;
  iVar3 = std::numeric_limits<int>::min();
  if ((in_EDI == iVar3) && (sVar2 = ::SafeInt::operator_cast_to_short(in_RDX), sVar2 == -1)) {
    local_12 = 0;
    bVar1 = div_negate_min<short,_int,_false>::Value(&local_12);
    if (bVar1) {
      SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
      operator=(unaff_retaddr,
                (short *)CONCAT17(in_stack_ffffffffffffffff,
                                  CONCAT16(in_stack_fffffffffffffffe,CONCAT24(in_SI,iVar4))));
      return true;
    }
    safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
  }
  return false;
}

Assistant:

static bool DivisionCornerCase2( U lhs, SafeInt< T, E > rhs, SafeInt<T, E>& result ) SAFEINT_CPP_THROW
    {
        if( lhs == std::numeric_limits< U >::min() && (T)rhs == -1 )
        {
            // corner case of a corner case - lhs = min int, rhs = -1,
            // but rhs is the return type, so in essence, we can return -lhs
            // if rhs is a larger type than lhs
            // If types are wrong, throws
            T tmp = 0;

            if (div_negate_min< T, U, sizeof(U) < sizeof(T) > ::Value(tmp))
                result = tmp;
            else
                E::SafeIntOnOverflow();

            return true;
        }

        return false;
    }